

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O1

errr Term_resize(wchar_t w,wchar_t h)

{
  size_t len;
  term_win *ptVar1;
  int *piVar2;
  term *ptVar3;
  ulong uVar4;
  errr eVar5;
  int *piVar6;
  term_win *ptVar7;
  term_win *ptVar8;
  term_win *ptVar9;
  ulong uVar10;
  term_win **pptVar11;
  wchar_t w_00;
  wchar_t h_00;
  ui_event local_68;
  int *local_58;
  int *local_50;
  term_win *local_48;
  term_win *local_40;
  ulong local_38;
  
  local_68._8_4_ = 0;
  local_68.type = EVT_RESIZE;
  local_68.mouse.x = '\0';
  local_68.mouse.y = '\0';
  local_68.mouse.button = '\0';
  local_68.mouse.mods = '\0';
  eVar5 = -1;
  if (((Term->fixed_shape == false) && (local_38 = (ulong)(uint)h, L'\0' < h && L'\0' < w)) &&
     ((w_00 = Term->wid, w_00 != w || (eVar5 = 1, Term->hgt != h)))) {
    if (w <= w_00) {
      w_00 = w;
    }
    h_00 = Term->hgt;
    if (h <= Term->hgt) {
      h_00 = h;
    }
    local_58 = Term->x1;
    local_50 = Term->x2;
    ptVar8 = Term->old;
    ptVar1 = Term->scr;
    ptVar9 = Term->mem;
    local_40 = Term->tmp;
    len = local_38 * 4;
    piVar6 = (int *)mem_zalloc(len);
    Term->x1 = piVar6;
    piVar6 = (int *)mem_zalloc(len);
    Term->x2 = piVar6;
    ptVar7 = (term_win *)mem_zalloc(0x60);
    Term->old = ptVar7;
    term_win_init(ptVar7,w,h);
    local_48 = ptVar8;
    term_win_copy(Term->old,ptVar8,w_00,h_00);
    ptVar8 = (term_win *)mem_zalloc(0x60);
    Term->scr = ptVar8;
    term_win_init(ptVar8,w,h);
    term_win_copy(Term->scr,ptVar1,w_00,h_00);
    if (ptVar9 != (term_win *)0x0) {
      pptVar11 = &Term->mem;
      do {
        ptVar8 = (term_win *)mem_zalloc(0x60);
        *pptVar11 = ptVar8;
        term_win_init(ptVar8,w,h);
        term_win_copy(*pptVar11,ptVar9,w_00,h_00);
        ptVar8 = ptVar9->next;
        ptVar7 = *pptVar11;
        if (w <= ptVar7->cx) {
          ptVar7->cu = true;
        }
        if (h <= ptVar7->cy) {
          ptVar7->cu = true;
        }
        pptVar11 = &ptVar7->next;
        term_win_nuke(ptVar9);
        mem_free(ptVar9);
        ptVar9 = ptVar8;
      } while (ptVar8 != (term_win *)0x0);
    }
    ptVar8 = local_40;
    if (local_40 != (term_win *)0x0) {
      ptVar9 = (term_win *)mem_zalloc(0x60);
      Term->tmp = ptVar9;
      term_win_init(ptVar9,w,h);
      term_win_copy(Term->tmp,ptVar8,w_00,h_00);
    }
    mem_free(local_58);
    mem_free(local_50);
    ptVar9 = local_48;
    term_win_nuke(local_48);
    mem_free(ptVar9);
    ptVar9 = Term->old;
    if (w <= ptVar9->cx) {
      ptVar9->cu = true;
    }
    if (h <= ptVar9->cy) {
      ptVar9->cu = true;
    }
    term_win_nuke(ptVar1);
    mem_free(ptVar1);
    uVar4 = local_38;
    ptVar1 = Term->scr;
    if (w <= ptVar1->cx) {
      ptVar1->cu = true;
    }
    if (h <= ptVar1->cy) {
      ptVar1->cu = true;
    }
    if (ptVar8 != (term_win *)0x0) {
      term_win_nuke(ptVar8);
      mem_free(ptVar8);
      ptVar8 = Term->tmp;
      if (w <= ptVar8->cx) {
        ptVar8->cu = true;
      }
      if (h <= ptVar8->cy) {
        ptVar8->cu = true;
      }
    }
    ptVar3 = Term;
    Term->wid = w;
    ptVar3->hgt = h;
    ptVar3->total_erase = true;
    if (L'\0' < h) {
      piVar6 = ptVar3->x1;
      piVar2 = ptVar3->x2;
      uVar10 = 0;
      do {
        piVar6[uVar10] = 0;
        piVar2[uVar10] = w + L'\xffffffff';
        uVar10 = uVar10 + 1;
      } while (uVar4 != uVar10);
    }
    ptVar3->y1 = 0;
    ptVar3->y2 = h + L'\xffffffff';
    Term_event_push(&local_68);
    eVar5 = 0;
  }
  return eVar5;
}

Assistant:

errr Term_resize(int w, int h)
{
	int i;

	int wid, hgt;

	int *hold_x1;
	int *hold_x2;

	term_win *hold_old;
	term_win *hold_scr;
	term_win *hold_mem;
	term_win **hold_mem_dest;
	term_win *hold_tmp;

	ui_event evt = EVENT_EMPTY;
	evt.type = EVT_RESIZE;

	/* Resizing is forbidden */
	if (Term->fixed_shape) return (-1);

	/* Ignore illegal changes */
	if ((w < 1) || (h < 1)) return (-1);

	/* Ignore non-changes */
	if ((Term->wid == w) && (Term->hgt == h)) return (1);

	/* Minimum dimensions */
	wid = MIN(Term->wid, w);
	hgt = MIN(Term->hgt, h);

	/* Save scanners */
	hold_x1 = Term->x1;
	hold_x2 = Term->x2;

	/* Save old window */
	hold_old = Term->old;

	/* Save old window */
	hold_scr = Term->scr;

	/* Save old window */
	hold_mem = Term->mem;

	/* Save old window */
	hold_tmp = Term->tmp;

	/* Create new scanners */
	Term->x1 = mem_zalloc(h * sizeof(int));
	Term->x2 = mem_zalloc(h * sizeof(int));

	/* Create new window */
	Term->old = mem_zalloc(sizeof(term_win));

	/* Initialize new window */
	term_win_init(Term->old, w, h);

	/* Save the contents */
	term_win_copy(Term->old, hold_old, wid, hgt);

	/* Create new window */
	Term->scr = mem_zalloc(sizeof(term_win));

	/* Initialize new window */
	term_win_init(Term->scr, w, h);

	/* Save the contents */
	term_win_copy(Term->scr, hold_scr, wid, hgt);

	/* If needed */
	hold_mem_dest = &Term->mem;
	while (hold_mem != 0) {
		term_win* trash;

		/* Create new window */
		*hold_mem_dest = mem_zalloc(sizeof(term_win));

		/* Initialize new window */
		term_win_init(*hold_mem_dest, w, h);

		/* Save the contents */
		term_win_copy(*hold_mem_dest, hold_mem, wid, hgt);

		trash = hold_mem;
		hold_mem = hold_mem->next;

		if ((*hold_mem_dest)->cx >= w) (*hold_mem_dest)->cu = 1;
		if ((*hold_mem_dest)->cy >= h) (*hold_mem_dest)->cu = 1;

		hold_mem_dest = &((*hold_mem_dest)->next);

		term_win_nuke(trash);
		mem_free(trash);
	}

	/* If needed */
	if (hold_tmp) {
		/* Create new window */
		Term->tmp = mem_zalloc(sizeof(term_win));

		/* Initialize new window */
		term_win_init(Term->tmp, w, h);

		/* Save the contents */
		term_win_copy(Term->tmp, hold_tmp, wid, hgt);
	}

	/* Free some arrays */
	mem_free(hold_x1);
	mem_free(hold_x2);

	/* Nuke */
	term_win_nuke(hold_old);

	/* Kill */
	mem_free(hold_old);

	/* Illegal cursor */
	if (Term->old->cx >= w) Term->old->cu = 1;
	if (Term->old->cy >= h) Term->old->cu = 1;

	/* Nuke */
	term_win_nuke(hold_scr);

	/* Kill */
	mem_free(hold_scr);

	/* Illegal cursor */
	if (Term->scr->cx >= w) Term->scr->cu = 1;
	if (Term->scr->cy >= h) Term->scr->cu = 1;

	/* If needed */
	if (hold_tmp) {
		/* Nuke */
		term_win_nuke(hold_tmp);

		/* Kill */
		mem_free(hold_tmp);

		/* Illegal cursor */
		if (Term->tmp->cx >= w) Term->tmp->cu = 1;
		if (Term->tmp->cy >= h) Term->tmp->cu = 1;
	}

	/* Save new size */
	Term->wid = w;
	Term->hgt = h;

	/* Force "total erase" */
	Term->total_erase = true;

	/* Assume change */
	for (i = 0; i < h; i++) {
		/* Assume change */
		Term->x1[i] = 0;
		Term->x2[i] = w - 1;
	}

	/* Assume change */
	Term->y1 = 0;
	Term->y2 = h - 1;

	/* Push a resize event onto the stack */
	Term_event_push(&evt);

	/* Success */
	return (0);
}